

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.c
# Opt level: O0

void modules_unregister(translation_module_t *modules,translation_module_t *module)

{
  translation_module_t *tmp;
  translation_module_t *module_local;
  translation_module_t *modules_local;
  
  tmp = modules;
  while( true ) {
    if (tmp->next == (s_translation_module *)0x0) {
      return;
    }
    if (tmp->next == module) break;
    tmp = tmp->next;
  }
  tmp->next = module->next;
  return;
}

Assistant:

void modules_unregister(translation_module_t *modules, translation_module_t *module) {
	translation_module_t *tmp = modules;
	while ( tmp->next != NULL ) {
		if ( tmp->next == module ) {
			tmp->next = module->next;
			break;
		}
		tmp = tmp->next;
	}
}